

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsmcpl.c
# Opt level: O1

int phits2mcpl_app(int argc,char **argv)

{
  uint uVar1;
  int do_gzip;
  int double_prec;
  char *dumphdrfile;
  char *cfgfile;
  char *outfile;
  char *infile;
  
  phits2mcpl_parse_args(argc,argv,&infile,&outfile,&cfgfile,&dumphdrfile,&double_prec,&do_gzip);
  uVar1 = phits2mcpl2(infile,outfile,double_prec,do_gzip,cfgfile,dumphdrfile);
  return uVar1 ^ 1;
}

Assistant:

int phits2mcpl_app(int argc,char** argv)
{
  const char * infile;
  const char * outfile;
  const char * cfgfile;
  const char * dumphdrfile;
  int double_prec, do_gzip;
  phits2mcpl_parse_args(argc,argv,&infile,&outfile,&cfgfile,&dumphdrfile,&double_prec,&do_gzip);
  int ok = phits2mcpl2(infile, outfile,double_prec, do_gzip,cfgfile,dumphdrfile);
  return ok ? 0 : 1;
}